

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O0

bool __thiscall
draco::DracoOptions<int>::IsAttributeOptionSet
          (DracoOptions<int> *this,AttributeKey *att_key,string *name)

{
  Options *pOVar1;
  int *in_RDX;
  DracoOptions<int> *in_RSI;
  Options *in_RDI;
  Options *att_options;
  string *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  pOVar1 = FindAttributeOptions(in_RSI,in_RDX);
  if (pOVar1 == (Options *)0x0) {
    local_1 = Options::IsOptionSet(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    local_1 = Options::IsOptionSet(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_1;
}

Assistant:

bool DracoOptions<AttributeKeyT>::IsAttributeOptionSet(
    const AttributeKey &att_key, const std::string &name) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options) {
    return att_options->IsOptionSet(name);
  }
  return global_options_.IsOptionSet(name);
}